

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void * __thiscall
c4::MemoryResourceLinear::do_allocate
          (MemoryResourceLinear *this,size_t sz,size_t alignment,void *hint)

{
  size_t sVar1;
  ulong uVar2;
  code *pcVar3;
  bool bVar4;
  void *pvVar5;
  ulong uVar6;
  size_t space;
  void *mem;
  ulong local_20;
  char *local_18;
  
  if (sz == 0) {
    local_18 = (char *)0x0;
  }
  else {
    local_20 = (this->super__MemoryResourceSingleChunk).m_size;
    sVar1 = (this->super__MemoryResourceSingleChunk).m_pos;
    if (local_20 < sVar1 + sz) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        pcVar3 = (code *)swi(3);
        pvVar5 = (void *)(*pcVar3)();
        return pvVar5;
      }
      handle_error(0x1fae9e,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x445a);
    }
    local_20 = local_20 - sVar1;
    local_18 = (this->super__MemoryResourceSingleChunk).m_mem + sVar1;
    pvVar5 = std::align(alignment,sz,&local_18,&local_20);
    if (pvVar5 == (void *)0x0) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        pcVar3 = (code *)swi(3);
        pvVar5 = (void *)(*pcVar3)();
        return pvVar5;
      }
      handle_error(0x1faed4,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x4469);
    }
    uVar2 = (this->super__MemoryResourceSingleChunk).m_size;
    uVar6 = (this->super__MemoryResourceSingleChunk).m_pos;
    if (uVar2 < uVar6) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        pcVar3 = (code *)swi(3);
        pvVar5 = (void *)(*pcVar3)();
        return pvVar5;
      }
      handle_error(0x1e7ac6,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x4461,"m_pos <= m_size");
    }
    if (uVar2 - uVar6 < local_20) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        pcVar3 = (code *)swi(3);
        pvVar5 = (void *)(*pcVar3)();
        return pvVar5;
      }
      handle_error(0x1e7ac6,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x4462,"m_size - m_pos >= space");
    }
    uVar6 = (sz + uVar2) - local_20;
    (this->super__MemoryResourceSingleChunk).m_pos = uVar6;
    if (uVar2 < uVar6) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        pcVar3 = (code *)swi(3);
        pvVar5 = (void *)(*pcVar3)();
        return pvVar5;
      }
      handle_error(0x1e7ac6,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x4465,"m_pos <= m_size");
    }
  }
  return local_18;
}

Assistant:

void* MemoryResourceLinear::do_allocate(size_t sz, size_t alignment, void *hint)
{
    C4_UNUSED(hint);
    if(sz == 0) return nullptr;
    // make sure there's enough room to allocate
    if(m_pos + sz > m_size)
    {
        C4_ERROR("out of memory");
        return nullptr;
    }
    void *mem = m_mem + m_pos;
    size_t space = m_size - m_pos;
    if(std::align(alignment, sz, mem, space))
    {
        C4_ASSERT(m_pos <= m_size);
        C4_ASSERT(m_size - m_pos >= space);
        m_pos += (m_size - m_pos) - space;
        m_pos += sz;
        C4_ASSERT(m_pos <= m_size);
    }
    else
    {
        C4_ERROR("could not align memory");
        mem = nullptr;
    }
    return mem;
}